

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O3

int stbi_zlib_decode_noheader_buffer(char *obuffer,int olen,char *ibuffer,int ilen)

{
  int iVar1;
  zbuf a;
  zbuf local_1010;
  
  local_1010.zbuffer_end = (uint8 *)(ibuffer + ilen);
  local_1010.zbuffer = (uint8 *)ibuffer;
  iVar1 = do_zlib(&local_1010,obuffer,olen,0,0);
  return -(uint)(iVar1 == 0) | (int)local_1010.zout - (int)local_1010.zout_start;
}

Assistant:

int stbi_zlib_decode_noheader_buffer(char *obuffer, int olen, const char *ibuffer, int ilen)
{
   zbuf a;
   a.zbuffer = (uint8 *) ibuffer;
   a.zbuffer_end = (uint8 *) ibuffer + ilen;
   if (do_zlib(&a, obuffer, olen, 0, 0))
      return (int) (a.zout - a.zout_start);
   else
      return -1;
}